

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyTraceRaysIndirectAttribs
               (IRenderDevice *pDevice,TraceRaysIndirectAttribs *Attribs,Uint32 SBTSize)

{
  IBuffer *pIVar1;
  int iVar2;
  uint uVar3;
  char (*Args_1) [39];
  char (*in_RCX) [77];
  IShaderBindingTable *pIVar4;
  char (*in_R9) [53];
  string msg;
  undefined4 extraout_var;
  
  pIVar4 = Attribs->pSBT;
  pIVar1 = Attribs->pAttribsBuffer;
  if (pIVar4 == (IShaderBindingTable *)0x0) {
    FormatString<char[42],char[22]>
              (&msg,(Diligent *)"Trace rays indirect attribs are invalid: ",(char (*) [42])0x5ba0a3,
               (char (*) [22])in_RCX);
    in_RCX = (char (*) [77])0x453;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x453);
    std::__cxx11::string::~string((string *)&msg);
    pIVar4 = Attribs->pSBT;
  }
  iVar2 = (*(pIVar4->super_IDeviceObject).super_IObject._vptr_IObject[8])(pIVar4,5);
  if ((char)iVar2 == '\0') {
    FormatString<char[42],char[77]>
              (&msg,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])
               "not all shaders in SBT are bound or instance to shader mapping is incorrect.",in_RCX
              );
    in_RCX = (char (*) [77])0x457;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x457);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (pIVar1 == (IBuffer *)0x0) {
    FormatString<char[42],char[53]>
              (&msg,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect dispatch arguments buffer must not be null.",
               (char (*) [53])in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x45a);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar2 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar1);
  Args_1 = (char (*) [39])CONCAT44(extraout_var,iVar2);
  uVar3 = *(uint *)(*Args_1 + 0x10);
  if ((uVar3 >> 8 & 1) == 0) {
    FormatString<char[42],char[39],char_const*,char[53]>
              (&msg,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect trace rays arguments buffer \'",Args_1,
               (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x45e);
    std::__cxx11::string::~string((string *)&msg);
    uVar3 = *(uint *)(*Args_1 + 0x10);
  }
  if ((uVar3 >> 10 & 1) == 0) {
    FormatString<char[42],char[39],char_const*,char[46]>
              (&msg,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect trace rays arguments buffer \'",Args_1,
               (char **)"\' was not created with BIND_RAY_TRACING flag.",(char (*) [46])in_R9);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x460);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (*(ulong *)(*Args_1 + 8) < (ulong)SBTSize + Attribs->ArgsByteOffset) {
    FormatString<char[42],char[39],char_const*,char[15]>
              (&msg,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect trace rays arguments buffer \'",Args_1,
               (char **)"\' is too small",(char (*) [15])in_R9);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x462);
    std::__cxx11::string::~string((string *)&msg);
  }
  return true;
}

Assistant:

bool VerifyTraceRaysIndirectAttribs(const IRenderDevice* pDevice, const TraceRaysIndirectAttribs& Attribs, Uint32 SBTSize)
{
    const IBuffer* pAttribsBuffer = Attribs.pAttribsBuffer;

#define CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Trace rays indirect attribs are invalid: ", __VA_ARGS__)
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Attribs.pSBT != nullptr, "pSBT must not be null");

#ifdef DILIGENT_DEVELOPMENT
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Attribs.pSBT->Verify(VERIFY_SBT_FLAG_SHADER_ONLY | VERIFY_SBT_FLAG_TLAS),
                                      "not all shaders in SBT are bound or instance to shader mapping is incorrect.");
#endif // DILIGENT_DEVELOPMENT

    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(pAttribsBuffer != nullptr, "indirect dispatch arguments buffer must not be null.");

    const BufferDesc& Desc = pAttribsBuffer->GetDesc();
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS((Desc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0,
                                      "indirect trace rays arguments buffer '", Desc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS((Desc.BindFlags & BIND_RAY_TRACING) != 0,
                                      "indirect trace rays arguments buffer '", Desc.Name, "' was not created with BIND_RAY_TRACING flag.");
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Attribs.ArgsByteOffset + SBTSize <= Desc.Size,
                                      "indirect trace rays arguments buffer '", Desc.Name, "' is too small");

#undef CHECK_TRACE_RAYS_INDIRECT_ATTRIBS

    return true;
}